

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::VerifyUtf8String
               (char *data,int size,Operation op,char *field_name)

{
  bool bVar1;
  char *local_30;
  char *operation_str;
  char *field_name_local;
  Operation op_local;
  int size_local;
  char *data_local;
  
  bVar1 = IsStructurallyValidUTF8(data,size);
  if (bVar1) {
    data_local._7_1_ = true;
  }
  else {
    local_30 = (char *)0x0;
    if (op == PARSE) {
      local_30 = "parsing";
    }
    else if (op == SERIALIZE) {
      local_30 = "serializing";
    }
    PrintUTF8ErrorLog(field_name,local_30,false);
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

bool WireFormatLite::VerifyUtf8String(const char* data, int size, Operation op,
                                      const char* field_name) {
  if (!IsStructurallyValidUTF8(data, size)) {
    const char* operation_str = nullptr;
    switch (op) {
      case PARSE:
        operation_str = "parsing";
        break;
      case SERIALIZE:
        operation_str = "serializing";
        break;
        // no default case: have the compiler warn if a case is not covered.
    }
    PrintUTF8ErrorLog(field_name, operation_str, false);
    return false;
  }
  return true;
}